

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtouch.c
# Opt level: O3

void touch_input_handle_end
               (int id,double timestamp,float x,float y,_Bool primary,ALLEGRO_DISPLAY *disp)

{
  undefined8 uVar1;
  undefined7 in_register_00000031;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (*(int *)((long)touch_ids + lVar2) == id) {
      _al_event_source_lock(&touch_input.es);
      uVar1 = *(undefined8 *)(&touch_input_state.touches[0].x + lVar2 * 2);
      *(ulong *)(&touch_input_state.touches[0].dx + lVar2 * 2) =
           CONCAT44(y - (float)((ulong)uVar1 >> 0x20),x - (float)uVar1);
      (&touch_input_state.touches[0].x)[lVar2 * 2] = x;
      (&touch_input_state.touches[0].y)[lVar2 * 2] = y;
      _al_event_source_unlock(&touch_input.es);
      generate_touch_input_event
                (0x33,timestamp,(&touch_input_state.touches[0].id)[lVar2 * 2],
                 (&touch_input_state.touches[0].x)[lVar2 * 2],
                 (&touch_input_state.touches[0].y)[lVar2 * 2],
                 (&touch_input_state.touches[0].dx)[lVar2 * 2],
                 (&touch_input_state.touches[0].dy)[lVar2 * 2],*(_Bool *)(lVar2 * 8 + 0x1e4c94),
                 (ALLEGRO_DISPLAY *)CONCAT71(in_register_00000031,primary));
      _al_event_source_lock(&touch_input.es);
      (&touch_input_state.touches[0].id)[lVar2 * 2] = -1;
      *(undefined4 *)((long)touch_ids + lVar2) = 0xffffffff;
      _al_event_source_unlock(&touch_input.es);
      return;
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

static void touch_input_handle_end(int id, double timestamp, float x, float y, bool primary, ALLEGRO_DISPLAY *disp)
{
   int index= find_touch_state_index_with_id(id);
   if (index < 0)
       return;

   ALLEGRO_TOUCH_STATE* state = touch_input_state.touches + index;
   (void)primary;

   if (NULL == state)
      return;

   _al_event_source_lock(&touch_input.es);
   state->dx = x - state->x;
   state->dy = y - state->y;
   state->x  = x;
   state->y  = y;
   _al_event_source_unlock(&touch_input.es);

   generate_touch_input_event(ALLEGRO_EVENT_TOUCH_END, timestamp,
      state->id, state->x, state->y, state->dx, state->dy, state->primary,
      disp);

   _al_event_source_lock(&touch_input.es);
   state->id = -1;
   touch_ids[index]= -1;
   _al_event_source_unlock(&touch_input.es);
}